

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterConfig::ReporterConfig
          (ReporterConfig *this,string *_name,ostream *_stream,bool _includeSuccessfulResults,
          ConfigData *_fullConfig)

{
  ConfigData *_fullConfig_local;
  bool _includeSuccessfulResults_local;
  ostream *_stream_local;
  string *_name_local;
  ReporterConfig *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  this->stream = _stream;
  this->includeSuccessfulResults = _includeSuccessfulResults;
  ConfigData::ConfigData(&this->fullConfig,_fullConfig);
  return;
}

Assistant:

ReporterConfig( const std::string& _name,
                        std::ostream& _stream,
                        bool _includeSuccessfulResults,
                        const ConfigData& _fullConfig )
        :   name( _name ),
            stream( _stream ),
            includeSuccessfulResults( _includeSuccessfulResults ),
            fullConfig( _fullConfig )
        {}